

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O1

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe61At6(uint8_t *buf)

{
  return ((ulong)*(ushort *)(buf + 2) |
         CONCAT44((uint)buf[6] | (uint)buf[7] << 8 | (uint)buf[8] << 0x10,
                  (uint)buf[4] << 0x10 | (uint)buf[5] << 0x18) & 0x7ffffffffffff) * 0x400 +
         (ulong)buf[1] * 4 | (ulong)(*buf >> 6);
}

Assistant:

std::uint64_t readFlUIntLe61At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[8];
    res <<= 8;
    res |= buf[7];
    res <<= 8;
    res |= buf[6];
    res <<= 8;
    res |= buf[5];
    res <<= 8;
    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x1fffffffffffffff);
    return res;
}